

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O2

void print_timerepr(FILE *f,TimeRepr *repr)

{
  if (0 < repr->days) {
    fprintf((FILE *)f,"%d day(s), ");
  }
  if (0 < repr->hours) {
    fprintf((FILE *)f,"%d hour(s), ");
  }
  if (0 < repr->minutes) {
    fprintf((FILE *)f,"%d minute(s), ");
  }
  if (0 < repr->seconds) {
    fprintf((FILE *)f,"%d second(s), ");
  }
  if (0 < repr->milliseconds) {
    fprintf((FILE *)f,"%d msec(s), ");
  }
  if (0 < repr->microseconds) {
    fprintf((FILE *)f,"%d usec(s)");
    return;
  }
  return;
}

Assistant:

void print_timerepr(FILE *f, const TimeRepr *repr) {
    if (repr->days > 0) {
        fprintf(f, "%d day(s), ", repr->days);
    }

    if (repr->hours > 0) {
        fprintf(f, "%d hour(s), ", repr->hours);
    }

    if (repr->minutes > 0) {
        fprintf(f, "%d minute(s), ", repr->minutes);
    }

    if (repr->seconds > 0) {
        fprintf(f, "%d second(s), ", repr->seconds);
    }

    if (repr->milliseconds > 0) {
        fprintf(f, "%d msec(s), ", repr->milliseconds);
    }

    if (repr->microseconds > 0) {
        fprintf(f, "%d usec(s)", repr->microseconds);
    }
}